

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O1

void sample_output<trng::mrg3s>(mrg3s *r,string *name)

{
  ostream *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  char local_2a [2];
  
  uVar5 = name->_M_string_length;
  while (uVar5 < 0x20) {
    std::__cxx11::string::push_back((char)name);
    uVar5 = name->_M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,uVar5);
  iVar3 = 0xf;
  do {
    iVar2 = (r->S).r[0];
    iVar4 = (r->S).r[1];
    uVar5 = (long)(r->S).r[2] * (long)(r->P).a[2] +
            (long)(r->P).a[1] * (long)iVar4 + (long)(r->P).a[0] * (long)iVar2;
    (r->S).r[2] = iVar4;
    (r->S).r[1] = iVar2;
    uVar5 = (uVar5 >> 0x1f) * -0x7fffadb3 + uVar5;
    uVar5 = (uVar5 >> 0x1f) * -0x7fffadb3 + uVar5;
    iVar2 = (int)uVar5;
    iVar4 = iVar2 + -0x7fffadb3;
    if (uVar5 < 0x7fffadb3) {
      iVar4 = iVar2;
    }
    (r->S).r[0] = iVar4;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    local_2a[0] = '\t';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a,1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = (r->S).r[0];
  iVar2 = (r->S).r[1];
  uVar5 = (long)(r->S).r[2] * (long)(r->P).a[2] +
          (long)(r->P).a[1] * (long)iVar2 + (long)(r->P).a[0] * (long)iVar3;
  (r->S).r[2] = iVar2;
  (r->S).r[1] = iVar3;
  uVar5 = (uVar5 >> 0x1f) * -0x7fffadb3 + uVar5;
  uVar5 = (uVar5 >> 0x1f) * -0x7fffadb3 + uVar5;
  iVar2 = (int)uVar5;
  iVar3 = iVar2 + -0x7fffadb3;
  if (uVar5 < 0x7fffadb3) {
    iVar3 = iVar2;
  }
  (r->S).r[0] = iVar3;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  local_2a[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a + 1,1);
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}